

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledInputFile::readTiles
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  value_type pTVar1;
  bool bVar2;
  size_type sVar3;
  ArgExc *pAVar4;
  ostream *poVar5;
  size_type sVar6;
  reference ppTVar7;
  IoExc *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  DeepTiledInputFile *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  stringstream _iex_replace_s;
  BaseExc *e;
  TileBuffer *tileBuffer;
  size_t i;
  string *exception;
  stringstream _iex_throw_s_1;
  int dx;
  int dy;
  int tileNumber;
  TaskGroup taskGroup;
  int dY;
  int dyStop;
  int dyStart;
  stringstream _iex_throw_s;
  Lock lock;
  int in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa14;
  DeepTiledInputFile *in_stack_fffffffffffffa18;
  Lock *in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa40;
  TileBufferTask_conflict *in_stack_fffffffffffffa48;
  Data *in_stack_fffffffffffffa50;
  TaskGroup *in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa70;
  size_type local_388;
  string *local_380;
  stringstream local_378 [16];
  ostream local_368 [380];
  int local_1ec;
  int local_1e8;
  int local_1e4;
  TaskGroup local_1e0 [12];
  int local_1d4;
  int local_1d0;
  int local_1cc;
  stringstream local_1c8 [16];
  ostream local_1b8 [412];
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c [3];
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffa20,(Mutex *)in_stack_fffffffffffffa18,
             SUB41((uint)in_stack_fffffffffffffa14 >> 0x18,0));
  sVar3 = std::
          vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
          ::size(&in_RDI->_data->slices);
  if (sVar3 == 0) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  bVar2 = isValidLevel(in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,in_stack_fffffffffffffa10
                      );
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar5 = std::operator<<(local_1b8,"Level coordinate (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_00000008);
    std::operator<<(poVar5,") is invalid.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,local_1c8);
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (local_10 < local_c[0]) {
    std::swap<int>(local_c,&local_10);
  }
  if (local_18 < local_14) {
    std::swap<int>(&local_14,&local_18);
  }
  local_1cc = local_14;
  local_1d0 = local_18 + 1;
  local_1d4 = 1;
  if (in_RDI->_data->lineOrder == DECREASING_Y) {
    local_1cc = local_18;
    local_1d0 = local_14 + -1;
    local_1d4 = -1;
  }
  IlmThread_2_5::TaskGroup::TaskGroup(local_1e0);
  local_1e4 = 0;
  for (local_1e8 = local_1cc; local_1e8 != local_1d0; local_1e8 = local_1d4 + local_1e8) {
    for (local_1ec = local_c[0]; local_1ec <= local_10; local_1ec = local_1ec + 1) {
      bVar2 = isValidTile(in_RDI,local_1ec,local_1e8,local_1c,in_stack_00000008);
      if (!bVar2) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_378);
        poVar5 = std::operator<<(local_368,"Tile (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1ec);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1e8);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
        poVar5 = std::operator<<(poVar5,",");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_00000008);
        std::operator<<(poVar5,") is not a valid tile.");
        pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar4,local_378);
        __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      local_1e4 = local_1e4 + 1;
      in_stack_fffffffffffffa48 =
           anon_unknown_8::newTileBufferTask
                     (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                      (int)((ulong)in_stack_fffffffffffffa48 >> 0x20),(int)in_stack_fffffffffffffa48
                      ,(int)((ulong)in_stack_fffffffffffffa40 >> 0x20),
                      (int)in_stack_fffffffffffffa40,(int)in_stack_fffffffffffffa70);
      IlmThread_2_5::ThreadPool::addGlobalTask(&in_stack_fffffffffffffa48->super_Task);
    }
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(local_1e0);
  local_380 = (string *)0x0;
  local_388 = 0;
  while( true ) {
    sVar3 = local_388;
    sVar6 = std::
            vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ::size(&in_RDI->_data->tileBuffers);
    if (sVar6 <= sVar3) break;
    ppTVar7 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[](&in_RDI->_data->tileBuffers,local_388);
    pTVar1 = *ppTVar7;
    if ((((pTVar1->exception).field_2._M_local_buf[0xc] & 1U) != 0) && (local_380 == (string *)0x0))
    {
      local_380 = (string *)&pTVar1->_sem;
    }
    (pTVar1->exception).field_2._M_local_buf[0xc] = '\0';
    local_388 = local_388 + 1;
  }
  if (local_380 != (string *)0x0) {
    this_00 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::IoExc::IoExc(this_00,local_380);
    __cxa_throw(this_00,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
  }
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
  return;
}

Assistant:

void
DeepTiledInputFile::readTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data destination.");

        if (!isValidLevel (lx, ly))
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");

        //
        // Determine the first and last tile coordinates in both dimensions.
        // We always attempt to read the range of tiles in the order that
        // they are stored in the file.
        //

        if (dx1 > dx2)
            std::swap (dx1, dx2);

        if (dy1 > dy2)
            std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;
            int tileNumber = 0;

            for (int dy = dyStart; dy != dyStop; dy += dY)
            {
                for (int dx = dx1; dx <= dx2; dx++)
                {
                    if (!isValidTile (dx, dy, lx, ly))
                        THROW (IEX_NAMESPACE::ArgExc,
                               "Tile (" << dx << ", " << dy << ", " <<
                               lx << "," << ly << ") is not a valid tile.");

                    ThreadPool::addGlobalTask (newTileBufferTask (&taskGroup,
                                                                  _data,
                                                                  tileNumber++,
                                                                  dx, dy,
                                                                  lx, ly));
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledInputFile::readTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size(); ++i)
        {
            TileBuffer *tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}